

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall MemoryManager::~MemoryManager(MemoryManager *this)

{
  uint8_t **ppuVar1;
  uint32_t i;
  long lVar2;
  uint32_t j;
  long lVar3;
  
  for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 1) {
    if (this->memory[lVar2] != (uint8_t **)0x0) {
      for (lVar3 = 0; ppuVar1 = this->memory[lVar2], lVar3 != 0x400; lVar3 = lVar3 + 1) {
        if (ppuVar1[lVar3] != (uint8_t *)0x0) {
          operator_delete__(ppuVar1[lVar3]);
          this->memory[lVar2][lVar3] = (uint8_t *)0x0;
        }
      }
      if (ppuVar1 != (uint8_t **)0x0) {
        operator_delete__(ppuVar1);
      }
      this->memory[lVar2] = (uint8_t **)0x0;
    }
  }
  return;
}

Assistant:

MemoryManager::~MemoryManager() {
  for (uint32_t i = 0; i < 1024; ++i) {
    if (this->memory[i] != nullptr) {
      for (uint32_t j = 0; j < 1024; ++j) {
        if (this->memory[i][j] != nullptr) {
          delete[] this->memory[i][j];
          this->memory[i][j] = nullptr;
        }
      }
      delete[] this->memory[i];
      this->memory[i] = nullptr;
    }
  }
}